

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O0

Window createDummyWindow(QOffscreenX11Info *x11,XVisualInfo *visualInfo)

{
  long lVar1;
  int iVar2;
  Display *pDVar3;
  Window WVar4;
  undefined8 uVar5;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  Window window;
  Colormap cmap;
  XSetWindowAttributes a;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = QOffscreenX11Info::display((QOffscreenX11Info *)0x12878c);
  WVar4 = QOffscreenX11Info::root
                    ((QOffscreenX11Info *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  uVar5 = XCreateColormap(pDVar3,WVar4,*in_RSI);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  uStack_70 = 0xaaaaaaaaaaaaaaaa;
  pDVar3 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128804);
  lVar1 = *(long *)(pDVar3 + 0xe8);
  iVar2 = QOffscreenX11Info::screenNumber((QOffscreenX11Info *)0x12881a);
  uStack_70 = *(undefined8 *)(lVar1 + 0x58 + (long)iVar2 * 0x80);
  pDVar3 = QOffscreenX11Info::display((QOffscreenX11Info *)0x12883f);
  lVar1 = *(long *)(pDVar3 + 0xe8);
  iVar2 = QOffscreenX11Info::screenNumber((QOffscreenX11Info *)0x128855);
  uStack_60 = *(undefined8 *)(lVar1 + 0x60 + (long)iVar2 * 0x80);
  local_18 = uVar5;
  pDVar3 = QOffscreenX11Info::display((QOffscreenX11Info *)0x128887);
  WVar4 = QOffscreenX11Info::root
                    ((QOffscreenX11Info *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  WVar4 = XCreateWindow(pDVar3,WVar4,0,0,100,100,0,*(undefined4 *)((long)in_RSI + 0x14),1,*in_RSI,
                        0x200a,&local_78);
  pDVar3 = QOffscreenX11Info::display((QOffscreenX11Info *)0x1288f7);
  XFreeColormap(pDVar3,uVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return WVar4;
  }
  __stack_chk_fail();
}

Assistant:

static Window createDummyWindow(QOffscreenX11Info *x11, XVisualInfo *visualInfo)
{
    Colormap cmap = XCreateColormap(x11->display(), x11->root(), visualInfo->visual, AllocNone);
    XSetWindowAttributes a;
    a.background_pixel = WhitePixel(x11->display(), x11->screenNumber());
    a.border_pixel = BlackPixel(x11->display(), x11->screenNumber());
    a.colormap = cmap;


    Window window = XCreateWindow(x11->display(), x11->root(),
                                  0, 0, 100, 100,
                                  0, visualInfo->depth, InputOutput, visualInfo->visual,
                                  CWBackPixel|CWBorderPixel|CWColormap, &a);
    XFreeColormap(x11->display(), cmap);
    return window;
}